

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_(void_*,_unsigned_long)>::UntypedPerformAction
          (FunctionMockerBase<void_(void_*,_unsigned_long)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<void> *pAVar1;
  ArgumentTuple *args;
  Action<void_(void_*,_unsigned_long)> action;
  Action<void_(void_*,_unsigned_long)> *in_stack_ffffffffffffffa8;
  Action<void_(void_*,_unsigned_long)> *this_00;
  Action<void_(void_*,_unsigned_long)> local_28 [2];
  
  this_00 = local_28;
  Action<void_(void_*,_unsigned_long)>::Action(this_00,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<void>::PerformAction<void(void*,unsigned_long)>
                     (this_00,(ArgumentTuple *)in_stack_ffffffffffffffa8);
  Action<void_(void_*,_unsigned_long)>::~Action((Action<void_(void_*,_unsigned_long)> *)0x13f021);
  return (UntypedActionResultHolderBase *)pAVar1;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }